

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::tryString(TokenStream *this,Token *token,ParseLocation *loc)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long in_RDI;
  int c;
  string str;
  Token *loc_00;
  Token *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  Token *in_stack_fffffffffffffe00;
  allocator *paVar3;
  byte local_1e5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  string local_1a8 [16];
  Stream<int> *in_stack_fffffffffffffe68;
  ParseLocation *in_stack_fffffffffffffe98;
  allocator local_111;
  string local_110 [96];
  string local_b0 [36];
  uint local_8c;
  undefined4 local_88;
  string local_78 [63];
  byte local_39;
  undefined8 *local_38;
  undefined8 *local_30;
  long local_28;
  long local_20;
  long local_18;
  uint local_c;
  
  std::__cxx11::string::string(local_78);
  local_18 = in_RDI + 0x40;
  piVar2 = Stream<int>::peek(in_stack_fffffffffffffe68);
  if (*piVar2 == 0x22) {
    local_20 = in_RDI + 0x40;
    Stream<int>::drop(in_stack_fffffffffffffe68);
    while( true ) {
      local_28 = in_RDI + 0x40;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Stream<int>::peek(in_stack_fffffffffffffe68);
      if (*(int *)__lhs == 0x22) break;
      local_30 = (undefined8 *)(in_RDI + 0x40);
      __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_30;
      local_8c = Stream<int>::get(in_stack_fffffffffffffe68);
      local_1e5 = 0;
      if (local_8c < 0x100) {
        local_1e5 = *(byte *)(in_RDI + 0x248 + (ulong)local_8c);
      }
      local_c = local_8c;
      if ((local_1e5 & 1) == 0) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
        iVar1 = (int)(char)local_8c;
        paVar3 = &local_111;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_110,1,(char)iVar1,paVar3);
        std::operator+((char *)CONCAT44(iVar1,in_stack_fffffffffffffdf8),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar1,in_stack_fffffffffffffdf8),(char *)__rhs);
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffe98);
        std::operator+(__lhs,__rhs_00);
        std::runtime_error::runtime_error((runtime_error *)__rhs,local_b0);
        __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator+=(local_78,(char)local_8c);
    }
    local_38 = (undefined8 *)(in_RDI + 0x40);
    loc_00 = (Token *)*local_38;
    Stream<int>::drop(in_stack_fffffffffffffe68);
    std::__cxx11::string::string(local_1a8,local_78);
    Token::Token(in_stack_fffffffffffffe00,
                 (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (Type)((ulong)in_stack_fffffffffffffdf0 >> 0x20),(ParseLocation *)loc_00);
    Token::operator=(in_stack_fffffffffffffdf0,loc_00);
    Token::~Token(in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_1a8);
    local_39 = 1;
  }
  else {
    local_39 = 0;
  }
  local_88 = 1;
  std::__cxx11::string::~string(local_78);
  return (bool)(local_39 & 1);
}

Assistant:

bool TokenStream::tryString(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (cin->peek() != '\"') return false;
    cin->drop();
    while (cin->peek() != '\"') {
      const int c = cin->get();
      if (!isStringChar(c)) THROW_RUNTIME_ERROR("invalid string character "+std::string(1,c)+" at "+loc.str());
      str += (char)c;
    }
    cin->drop();
    token = Token(str,Token::TY_STRING,loc);
    return true;
  }